

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FpgaIO.cpp
# Opt level: O2

int __thiscall
FpgaIO::PromProgramPage(FpgaIO *this,uint32_t addr,uint8_t *bytes,uint nbytes,ProgressCallback cb)

{
  BasePort *pBVar1;
  bool bVar2;
  uint32_t uVar3;
  int iVar4;
  ostream *poVar5;
  undefined8 uVar6;
  uint uVar7;
  string *this_00;
  char *local_2e8 [4];
  quadlet_t read_data;
  uint32_t status;
  ulong local_2c0;
  uint32_t nWritten;
  ostringstream msg;
  uint8_t page_data [260];
  
  this_00 = (string *)local_2e8;
  if (nbytes < 0x101) {
    PromWriteEnable(this,PROM_M25P16);
    page_data._0_4_ = (addr & 0xff0000) >> 8 | 2 | (addr & 0xff00) << 8 | addr << 0x18;
    memcpy(page_data + 4,bytes,(ulong)nbytes);
    uVar3 = BoardIO::GetFirmwareVersion(&this->super_BoardIO);
    uVar6 = 0xc0;
    if (3 < uVar3) {
      uVar6 = 0x2000;
    }
    pBVar1 = (this->super_BoardIO).port;
    iVar4 = (*pBVar1->_vptr_BasePort[0x27])
                      (pBVar1,(ulong)(this->super_BoardIO).BoardId,uVar6,page_data,
                       (ulong)(nbytes + 4));
    if ((char)iVar4 != '\0') {
      pBVar1 = (this->super_BoardIO).port;
      iVar4 = (*pBVar1->_vptr_BasePort[0x23])
                        (pBVar1,(ulong)(this->super_BoardIO).BoardId,8,&read_data);
      if ((char)iVar4 == '\0') {
        return -1;
      }
      local_2c0 = (ulong)nbytes;
      do {
        if ((read_data & 0xf) == 0) {
          if (0xffffff < read_data) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
            poVar5 = std::operator<<((ostream *)&msg,"FpgaIO::PromProgramPage: FPGA error = ");
            std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
            if (cb == (ProgressCallback)0x0) {
              std::__cxx11::stringbuf::str();
              poVar5 = std::operator<<((ostream *)&std::cerr,(string *)local_2e8);
              std::endl<char,std::char_traits<char>>(poVar5);
            }
            else {
              std::__cxx11::stringbuf::str();
              (*cb)(local_2e8[0]);
            }
            std::__cxx11::string::~string((string *)local_2e8);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
          }
          bVar2 = PromGetResult(this,&nWritten,PROM_M25P16);
          if (!bVar2) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
            std::operator<<((ostream *)&msg,"FpgaIO::PromProgramPage: could not get PROM result");
            if (cb == (ProgressCallback)0x0) {
              std::__cxx11::stringbuf::str();
              poVar5 = std::operator<<((ostream *)&std::cerr,(string *)local_2e8);
              std::endl<char,std::char_traits<char>>(poVar5);
            }
            else {
              std::__cxx11::stringbuf::str();
              (*cb)(local_2e8[0]);
            }
            std::__cxx11::string::~string((string *)local_2e8);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
          }
          uVar7 = nWritten * 4 - 4;
          if (nWritten == 0) {
            uVar7 = 0;
          }
          if (uVar7 != nbytes) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
            poVar5 = std::operator<<((ostream *)&msg,"FpgaIO::PromProgramPage: wrote ");
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
            poVar5 = std::operator<<(poVar5," of ");
            poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
            std::operator<<(poVar5," bytes");
            if (cb == (ProgressCallback)0x0) {
              std::__cxx11::stringbuf::str();
              poVar5 = std::operator<<((ostream *)&std::cerr,(string *)local_2e8);
              std::endl<char,std::char_traits<char>>(poVar5);
            }
            else {
              std::__cxx11::stringbuf::str();
              (*cb)(local_2e8[0]);
            }
            std::__cxx11::string::~string((string *)local_2e8);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
          }
          local_2c0 = CONCAT44(local_2c0._4_4_,uVar7);
          bVar2 = PromGetStatus(this,&status,PROM_M25P16);
          do {
            if (((byte)status & 1) == 0) {
              return (int)local_2c0;
            }
            if (bVar2 == false) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
              poVar5 = std::operator<<((ostream *)&msg,
                                       "FpgaIO::PromProgramPage: could not get PROM status");
              std::endl<char,std::char_traits<char>>(poVar5);
              if (cb == (ProgressCallback)0x0) {
                std::__cxx11::stringbuf::str();
                poVar5 = std::operator<<((ostream *)&std::cerr,(string *)local_2e8);
                std::endl<char,std::char_traits<char>>(poVar5);
              }
              else {
                std::__cxx11::stringbuf::str();
                (*cb)(local_2e8[0]);
              }
              std::__cxx11::string::~string((string *)local_2e8);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
            }
            else if (cb == (ProgressCallback)0x0) {
              std::operator<<((ostream *)&std::cout,'.');
            }
            else {
              bVar2 = (*cb)((char *)0x0);
              if (!bVar2) {
                return 0;
              }
            }
            bVar2 = PromGetStatus(this,&status,PROM_M25P16);
          } while( true );
        }
        if (cb == (ProgressCallback)0x0) {
          std::operator<<((ostream *)&std::cout,'.');
        }
        else {
          bVar2 = (*cb)((char *)0x0);
          if (!bVar2) {
            return -1;
          }
        }
        pBVar1 = (this->super_BoardIO).port;
        iVar4 = (*pBVar1->_vptr_BasePort[0x23])
                          (pBVar1,(ulong)(this->super_BoardIO).BoardId,8,&read_data);
      } while ((char)iVar4 != '\0');
      return -1;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
    poVar5 = std::operator<<((ostream *)&msg,
                             "FpgaIO::PromProgramPage: failed to write block, nbytes = ");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    if (cb == (ProgressCallback)0x0) {
      std::__cxx11::stringbuf::str();
      poVar5 = std::operator<<((ostream *)&std::cerr,(string *)local_2e8);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    else {
      std::__cxx11::stringbuf::str();
      (*cb)(local_2e8[0]);
      this_00 = (string *)local_2e8;
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
    poVar5 = std::operator<<((ostream *)&msg,"FpgaIO::PromProgramPage: error, nbytes = ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    poVar5 = std::operator<<(poVar5," (max = ");
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::operator<<(poVar5,")");
    if (cb == (ProgressCallback)0x0) {
      std::__cxx11::stringbuf::str();
      poVar5 = std::operator<<((ostream *)&std::cerr,(string *)page_data);
      std::endl<char,std::char_traits<char>>(poVar5);
    }
    else {
      std::__cxx11::stringbuf::str();
      (*cb)((char *)CONCAT44(page_data._4_4_,page_data._0_4_));
    }
    this_00 = (string *)page_data;
  }
  std::__cxx11::string::~string(this_00);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
  return -1;
}

Assistant:

int FpgaIO::PromProgramPage(uint32_t addr, const uint8_t *bytes,
                           unsigned int nbytes, const ProgressCallback cb)
{
    const unsigned int MAX_PAGE = 256;  // 64 quadlets
    if (nbytes > MAX_PAGE) {
        std::ostringstream msg;
        msg << "FpgaIO::PromProgramPage: error, nbytes = " << nbytes
            << " (max = " << MAX_PAGE << ")";
        ERROR_CALLBACK(cb, msg);
        return -1;
    }
    PromWriteEnable();
    // Block write of the data (+1 quad for command)
    uint8_t page_data[MAX_PAGE+sizeof(quadlet_t)];
    quadlet_t *data_ptr = reinterpret_cast<quadlet_t *>(page_data);
    // First quadlet is the "page program" instruction (0x02)
    data_ptr[0] = bswap_32(0x02000000 | (addr & 0x00ffffff));
    // Remaining quadlets are the data to be programmed. These do not
    // need to be byte-swapped.
    memcpy(page_data+sizeof(quadlet_t), bytes, nbytes);

    // select address based on firmware version number
    uint32_t fver = GetFirmwareVersion();
    nodeaddr_t address;
    if (fver >= 4) {address = 0x2000;}
    else {address = 0xc0;}
    if (!port->WriteBlock(BoardId, address, data_ptr, nbytes+sizeof(quadlet_t))) {
        std::ostringstream msg;
        msg << "FpgaIO::PromProgramPage: failed to write block, nbytes = " << nbytes;
        ERROR_CALLBACK(cb, msg);
        return -1;
    }
    // Read FPGA status register; if 4 LSB are 0, command has finished
    quadlet_t read_data;
    if (!port->ReadQuadlet(BoardId, 0x08, read_data)) return -1;
    while (read_data&0x000f) {
        PROGRESS_CALLBACK(cb, -1);
        if (!port->ReadQuadlet(BoardId, 0x08, read_data)) return -1;
    }
    if (read_data & 0xff000000) { // shouldn't happen
        std::ostringstream msg;
        msg << "FpgaIO::PromProgramPage: FPGA error = " << read_data;
        ERROR_CALLBACK(cb, msg);
    }
    // Now, read result. This should be the number of quadlets written.
    uint32_t nWritten;
    if (!PromGetResult(nWritten)) {
        std::ostringstream msg;
        msg << "FpgaIO::PromProgramPage: could not get PROM result";
        ERROR_CALLBACK(cb, msg);
    }
    if (nWritten > 0)
        nWritten = 4*(nWritten-1);  // convert from quadlets to bytes
    if (nWritten != nbytes) {
        std::ostringstream msg;
        msg << "FpgaIO::PromProgramPage: wrote " << nWritten << " of "
            << nbytes << " bytes";
        ERROR_CALLBACK(cb, msg);
    }
    // Wait for "Write in Progress" bit to be cleared
    uint32_t status;
    bool ret = PromGetStatus(status);
    while (status&MASK_WIP) {
        if (ret) {
            PROGRESS_CALLBACK(cb, 0);
        }
        else {
            std::ostringstream msg;
            msg << "FpgaIO::PromProgramPage: could not get PROM status" << std::endl;
            ERROR_CALLBACK(cb, msg);
        }
        ret = PromGetStatus(status);
    }
    return nWritten;
}